

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O0

_Bool do_vfm_sp(DisasContext_conflict1 *s,arg_VFMA_sp *a,_Bool neg_n,_Bool neg_d)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  TCGv_i32 var;
  TCGv_i32 var_00;
  TCGv_i32 var_01;
  TCGv_ptr arg4;
  TCGv_i32 vd;
  TCGv_i32 vm;
  TCGv_i32 vn;
  TCGv_ptr fpst;
  TCGContext_conflict1 *tcg_ctx;
  _Bool neg_d_local;
  _Bool neg_n_local;
  arg_VFMA_sp *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  _Var1 = isar_feature_aa32_simdfmac(s->isar);
  if ((_Var1) && (_Var1 = isar_feature_aa32_fpsp_v2(s->isar), _Var1)) {
    if ((s->vec_len == 0) && (s->vec_stride == 0)) {
      _Var1 = vfp_access_check(s);
      if (_Var1) {
        var = tcg_temp_new_i32(tcg_ctx_00);
        var_00 = tcg_temp_new_i32(tcg_ctx_00);
        var_01 = tcg_temp_new_i32(tcg_ctx_00);
        neon_load_reg32(tcg_ctx_00,var,a->vn);
        neon_load_reg32(tcg_ctx_00,var_00,a->vm);
        if (neg_n) {
          gen_helper_vfp_negs(tcg_ctx_00,var,var);
        }
        neon_load_reg32(tcg_ctx_00,var_01,a->vd);
        if (neg_d) {
          gen_helper_vfp_negs(tcg_ctx_00,var_01,var_01);
        }
        arg4 = get_fpstatus_ptr_aarch64(tcg_ctx_00,0);
        gen_helper_vfp_muladds(tcg_ctx_00,var_01,var,var_00,var_01,arg4);
        neon_store_reg32(tcg_ctx_00,var_01,a->vd);
        tcg_temp_free_ptr(tcg_ctx_00,arg4);
        tcg_temp_free_i32(tcg_ctx_00,var);
        tcg_temp_free_i32(tcg_ctx_00,var_00);
        tcg_temp_free_i32(tcg_ctx_00,var_01);
        s_local._7_1_ = true;
      }
      else {
        s_local._7_1_ = true;
      }
    }
    else {
      s_local._7_1_ = false;
    }
  }
  else {
    s_local._7_1_ = false;
  }
  return s_local._7_1_;
}

Assistant:

static bool do_vfm_sp(DisasContext *s, arg_VFMA_sp *a, bool neg_n, bool neg_d)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    /*
     * VFNMA : fd = muladd(-fd,  fn, fm)
     * VFNMS : fd = muladd(-fd, -fn, fm)
     * VFMA  : fd = muladd( fd,  fn, fm)
     * VFMS  : fd = muladd( fd, -fn, fm)
     *
     * These are fused multiply-add, and must be done as one floating
     * point operation with no rounding between the multiplication and
     * addition steps.  NB that doing the negations here as separate
     * steps is correct : an input NaN should come out with its sign
     * bit flipped if it is a negated-input.
     */
    TCGv_ptr fpst;
    TCGv_i32 vn, vm, vd;

    /*
     * Present in VFPv4 only.
     * Note that we can't rely on the SIMDFMAC check alone, because
     * in a Neon-no-VFP core that ID register field will be non-zero.
     */
    if (!dc_isar_feature(aa32_simdfmac, s) ||
        !dc_isar_feature(aa32_fpsp_v2, s)) {
        return false;
    }
    /*
     * In v7A, UNPREDICTABLE with non-zero vector length/stride; from
     * v8A, must UNDEF. We choose to UNDEF for both v7A and v8A.
     */
    if (s->vec_len != 0 || s->vec_stride != 0) {
        return false;
    }

    if (!vfp_access_check(s)) {
        return true;
    }

    vn = tcg_temp_new_i32(tcg_ctx);
    vm = tcg_temp_new_i32(tcg_ctx);
    vd = tcg_temp_new_i32(tcg_ctx);

    neon_load_reg32(tcg_ctx, vn, a->vn);
    neon_load_reg32(tcg_ctx, vm, a->vm);
    if (neg_n) {
        /* VFNMS, VFMS */
        gen_helper_vfp_negs(tcg_ctx, vn, vn);
    }
    neon_load_reg32(tcg_ctx, vd, a->vd);
    if (neg_d) {
        /* VFNMA, VFNMS */
        gen_helper_vfp_negs(tcg_ctx, vd, vd);
    }
    fpst = get_fpstatus_ptr(tcg_ctx, 0);
    gen_helper_vfp_muladds(tcg_ctx, vd, vn, vm, vd, fpst);
    neon_store_reg32(tcg_ctx, vd, a->vd);

    tcg_temp_free_ptr(tcg_ctx, fpst);
    tcg_temp_free_i32(tcg_ctx, vn);
    tcg_temp_free_i32(tcg_ctx, vm);
    tcg_temp_free_i32(tcg_ctx, vd);

    return true;
}